

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
::
emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
          (SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
           *this,_func_void_Replacer_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  Expression **ppEVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  
  uVar5 = *(ulong *)this;
  if (uVar5 < 10) {
    *(ulong *)this = uVar5 + 1;
    ppEVar1 = *Args_1;
    *(_func_void_Replacer_ptr_Expression_ptr_ptr **)(this + uVar5 * 0x10 + 8) = *Args;
    *(Expression ***)(this + uVar5 * 0x10 + 0x10) = ppEVar1;
  }
  else {
    puVar2 = *(undefined8 **)(this + 0xb0);
    if (puVar2 == *(undefined8 **)(this + 0xb8)) {
      puVar3 = *(undefined8 **)(this + 0xa8);
      if ((long)puVar2 - (long)puVar3 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = (long)puVar2 - (long)puVar3 >> 4;
      uVar5 = 1;
      if (puVar2 != puVar3) {
        uVar5 = uVar9;
      }
      uVar8 = uVar5 + uVar9;
      if (0x7fffffffffffffe < uVar8) {
        uVar8 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar5,uVar9)) {
        uVar8 = 0x7ffffffffffffff;
      }
      if (uVar8 == 0) {
        puVar6 = (undefined8 *)0x0;
      }
      else {
        puVar6 = (undefined8 *)operator_new(uVar8 << 4);
      }
      ppEVar1 = *Args_1;
      puVar6[uVar9 * 2] = *Args;
      puVar6[uVar9 * 2 + 1] = ppEVar1;
      puVar10 = puVar6;
      for (puVar7 = puVar3; puVar2 != puVar7; puVar7 = puVar7 + 2) {
        uVar4 = puVar7[1];
        *puVar10 = *puVar7;
        puVar10[1] = uVar4;
        puVar10 = puVar10 + 2;
      }
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,*(long *)(this + 0xb8) - (long)puVar3);
      }
      *(undefined8 **)(this + 0xa8) = puVar6;
      *(undefined8 **)(this + 0xb0) = puVar10 + 2;
      *(undefined8 **)(this + 0xb8) = puVar6 + uVar8 * 2;
    }
    else {
      ppEVar1 = *Args_1;
      *puVar2 = *Args;
      puVar2[1] = ppEVar1;
      *(undefined8 **)(this + 0xb0) = puVar2 + 2;
    }
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }